

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bigint<13> * __thiscall bigint<13>::rshift<13>(bigint<13> *this,bigint<13> *x,int n)

{
  ushort uVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar2 = this->len;
  if (n != 0 && iVar2 != 0) {
    uVar4 = (n + -1) / 0x10;
    iVar5 = (n + -1) % 0x10;
    uVar1 = x->digits[(int)uVar4];
    uVar7 = ~uVar4 + iVar2;
    iVar6 = iVar5 + 1;
    uVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    for (; uVar3 = uVar1 >> ((byte)iVar6 & 0x1f), uVar9 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = x->digits[(int)(uVar4 + 1 + (int)uVar8)];
      this->digits[uVar8] = uVar1 << (0xfU - (char)iVar5 & 0x1f) | uVar3;
    }
    this->digits[(int)uVar7] = uVar3;
    this->len = iVar2 - ((iVar6 >> 0x10) + uVar4);
    shrink(this);
  }
  return this;
}

Assistant:

bigint &rshift(const bigint<X_DIGITS> &x, int n)
    {
        if(!len || !n) return *this;
        int dig = (n-1)/BI_DIGIT_BITS;
        n = ((n-1) % BI_DIGIT_BITS)+1;
        digit carry = digit(x.digits[dig]>>n);
        loopi(len-dig-1)
        {
            digit tmp = x.digits[i+dig+1];
            digits[i] = digit((tmp<<(BI_DIGIT_BITS-n)) | carry);
            carry = digit(tmp>>n);
        }
        digits[len-dig-1] = carry;
        len -= dig + (n>>BI_DIGIT_BITS);
        shrink();
        return *this;
    }